

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_test.cpp
# Opt level: O0

int noargs(void)

{
  size_t sourceSize;
  program_t *value;
  stack_t *psVar1;
  program_t *prog;
  vm_t vm;
  value_t *tmp;
  
  deci::vm_t::vm_t((vm_t *)&prog);
  sourceSize = deci::countof<deci::command_t,10ul>(&commands);
  value = deci::program_t::Create(commands,sourceSize);
  psVar1 = deci::vm_t::GlobalStack((vm_t *)&prog);
  vm.dataStack.result = deci::vm_t::Run((vm_t *)&prog,(value_t *)value);
  deci::stack_t::Push(psVar1,vm.dataStack.result);
  psVar1 = deci::vm_t::GlobalStack((vm_t *)&prog);
  deci::stack_t::Print(psVar1,(ostream *)&std::cout);
  (*(vm.dataStack.result)->_vptr_value_t[3])();
  (*(value->super_function_t).super_value_t._vptr_value_t[3])();
  deci::vm_t::~vm_t((vm_t *)&prog);
  return 0;
}

Assistant:

int noargs() {
  deci::value_t* tmp;
  deci::vm_t vm;
  deci::program_t* prog = deci::program_t::Create(commands, deci::countof(commands));

  vm.GlobalStack().Push(*(tmp = vm.Run(*prog)));
  vm.GlobalStack().Print(std::cout);

  tmp->Delete();
  prog->Delete();
  return 0;
}